

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoa.hpp
# Opt level: O2

double ear::hoa::sph_harm<double(*)(int,int)>(int n,int m,double az,double el,norm_f_t *norm)

{
  int m_00;
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (m < 1) {
    if (m < 0) {
      dVar1 = sin((double)m * az);
      dVar1 = dVar1 * -1.4142135623730951;
    }
    else {
      dVar1 = 1.0;
    }
  }
  else {
    dVar1 = cos((double)m * az);
    dVar1 = dVar1 * 1.4142135623730951;
  }
  m_00 = -m;
  if (0 < m) {
    m_00 = m;
  }
  dVar2 = (*norm)(n,m_00);
  dVar3 = sin(el);
  dVar3 = Alegendre(n,m_00,dVar3);
  return dVar3 * dVar2 * dVar1;
}

Assistant:

double sph_harm(int n, int m, double az, double el, NormT norm) {
      double scale;
      if (m > 0)
        scale = std::sqrt(2.0) * std::cos(m * az);
      else if (m < 0)
        scale = -std::sqrt(2.0) * std::sin(m * az);
      else
        scale = 1;

      return norm(n, std::abs(m)) * Alegendre(n, std::abs(m), std::sin(el)) *
             scale;
    }